

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

void __thiscall MADPComponentFactoredStates::PrintDebugStuff(MADPComponentFactoredStates *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  stringstream ss;
  string local_380 [32];
  string local_360 [32];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "MADPComponentFactoredStates::SetInitialized(true) run");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"*this* (at mem address");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,") has ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"_m_initialized=");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"_m_nrStates=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"_m_nrStateFactors=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"_m_sfacDomainSizes=");
  std::__cxx11::stringstream::stringstream(local_340);
  puVar3 = (this->_m_sfacDomainSizes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->_m_sfacDomainSizes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::operator<<(local_330,"< ");
  for (; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (puVar3 != (this->_m_sfacDomainSizes).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_330,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_330,local_360);
    std::__cxx11::string::~string(local_360);
  }
  std::operator<<(local_330," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  poVar2 = std::operator<<(poVar2,local_380);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_380);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void MADPComponentFactoredStates::PrintDebugStuff() const
{
    cout << "-----------------------------------------------------"<<endl;
    cout << "MADPComponentFactoredStates::SetInitialized(true) run"<<endl;
    cout << "*this* (at mem address"<<this<<") has "<<endl;
    cout << "_m_initialized="<<_m_initialized<<endl;
    cout << "_m_nrStates="<<_m_nrStates<<endl;
    cout << "_m_nrStateFactors="<<_m_nrStateFactors<<endl;
    cout << "_m_sfacDomainSizes="<<SoftPrintVector(_m_sfacDomainSizes)<<
        endl;
    cout << "-----------------------------------------------------"<<endl;
}